

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_8x4(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  int in_ECX;
  int in_EDX;
  __m128i *in_RSI;
  int16_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int16_t *tmp;
  int16_t *topR;
  int16_t *topL;
  int16_t *local_30;
  int16_t *local_28;
  
  local_30 = in_RDI + 4;
  local_28 = in_RDI;
  if (in_R8D != 0) {
    local_30 = in_RDI;
    local_28 = in_RDI + 4;
  }
  load_buffer_4x4(local_28,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  load_buffer_4x4(local_30,in_RSI + 4,in_EDX,in_ECX,in_R8D,in_R9D);
  return;
}

Assistant:

static inline void load_buffer_8x4(const int16_t *input, __m128i *out,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  const int16_t *topL = input;
  const int16_t *topR = input + 4;

  const int16_t *tmp;

  if (fliplr) {
    tmp = topL;
    topL = topR;
    topR = tmp;
  }

  load_buffer_4x4(topL, out, stride, flipud, fliplr, shift);
  load_buffer_4x4(topR, out + 4, stride, flipud, fliplr, shift);
}